

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::inspectActiveSubroutineUniformiv
          (FunctionalTest3_4 *this,GLuint program_id,GLchar **uniform_names)

{
  ostringstream *this_00;
  uint uVar1;
  bool bVar2;
  int iVar3;
  deUint32 dVar4;
  undefined4 extraout_var;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong uVar10;
  GLuint i;
  long lVar11;
  long lVar12;
  GLint n_active_subroutine_uniforms;
  vector<int,_std::allocator<int>_> compatible_subroutines;
  GLenum local_1d8 [8];
  GLchar **local_1b8;
  MessageBuilder message;
  long lVar5;
  
  local_1b8 = uniform_names;
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_1d8[0] = 0x8e4a;
  local_1d8[1] = this->m_n_active_subroutines;
  local_1d8[2] = 0x8a38;
  local_1d8[3] = this->m_n_active_subroutine_uniform_size;
  local_1d8[4] = 0x8a39;
  (**(code **)(lVar5 + 0x9d0))(program_id,0x8b31,0x8de6);
  dVar4 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar4,"GetProgramStageiv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                  ,0xd7f);
  bVar9 = true;
  for (uVar10 = 0; (long)uVar10 < 0; uVar10 = uVar10 + 1) {
    sVar6 = strlen(local_1b8[uVar10]);
    local_1d8[5] = (int)sVar6 + 1;
    for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
      bVar2 = checkActiveSubroutineUniformiv
                        (this,program_id,(GLuint)uVar10,local_1d8[lVar11 * 2],
                         local_1d8[lVar11 * 2 + 1]);
      bVar9 = (bool)(bVar9 & bVar2);
    }
    compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::resize
              (&compatible_subroutines,(long)this->m_n_active_subroutines);
    (**(code **)(lVar5 + 0x748))
              (program_id,0x8b31,uVar10 & 0xffffffff,0x8e4b,
               compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    glu::checkError(dVar4,"getActiveSubroutineUniformiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xd98);
    uVar1 = this->m_n_active_subroutines;
    uVar7 = 0;
    uVar8 = 0;
    if (0 < (int)uVar1) {
      uVar8 = (ulong)uVar1;
    }
    iVar3 = 0;
    for (; uVar8 != uVar7; uVar7 = uVar7 + 1) {
      iVar3 = iVar3 + compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
    }
    if ((int)((uVar1 - 1) * uVar1) / 2 != iVar3) {
      message.m_log = ((this->super_TestCase).m_context)->m_testCtx->m_log;
      this_00 = &message.m_str;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: ");
      std::ostream::operator<<(this_00,(GLuint)uVar10);
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,". pname: ");
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,
                      "GL_COMPATIBLE_SUBROUTINES");
      std::operator<<(&this_00->super_basic_ostream<char,_std::char_traits<char>_>,". Results: ");
      lVar11 = 4;
      for (lVar12 = 1; lVar12 < this->m_n_active_subroutines; lVar12 = lVar12 + 1) {
        tcu::MessageBuilder::operator<<
                  (&message,(int *)((long)compatible_subroutines.
                                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                          super__Vector_impl_data._M_start + lVar11));
        lVar11 = lVar11 + 4;
      }
      tcu::MessageBuilder::operator<<(&message,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&message.m_str);
      bVar9 = false;
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&compatible_subroutines.super__Vector_base<int,_std::allocator<int>_>);
  }
  return bVar9;
}

Assistant:

bool FunctionalTest3_4::inspectActiveSubroutineUniformiv(GLuint program_id, const GLchar** uniform_names) const
{
	const glw::Functions& gl						   = m_context.getRenderContext().getFunctions();
	bool				  result					   = true;
	GLint				  n_active_subroutine_uniforms = 0;

	inspectionDetails details[] = {
		{ GL_NUM_COMPATIBLE_SUBROUTINES, m_n_active_subroutines },
		{ GL_UNIFORM_SIZE, m_n_active_subroutine_uniform_size },
		{ GL_UNIFORM_NAME_LENGTH, 0 },
	};
	const GLuint n_details = sizeof(details) / sizeof(details[0]);

	/* Get amount of active subroutine uniforms */
	gl.getProgramStageiv(program_id, GL_VERTEX_SHADER, GL_ACTIVE_SUBROUTINE_UNIFORMS, &n_active_subroutine_uniforms);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetProgramStageiv");

	for (GLint uniform = 0; uniform < n_active_subroutine_uniforms; ++uniform)
	{
		GLint name_length = (GLint)strlen(uniform_names[uniform]);

		details[2].expected_value = name_length + 1;

		/* Checks from "details" */
		for (GLuint i = 0; i < n_details; ++i)
		{
			if (false ==
				checkActiveSubroutineUniformiv(program_id, uniform, details[i].pname, details[i].expected_value))
			{
				result = false;
			}
		}

		/* Check compatible subroutines */
		std::vector<GLint> compatible_subroutines;
		compatible_subroutines.resize(m_n_active_subroutines);
		GLint index_sum = 0;

		gl.getActiveSubroutineUniformiv(program_id, GL_VERTEX_SHADER, uniform, GL_COMPATIBLE_SUBROUTINES,
										&compatible_subroutines[0]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "getActiveSubroutineUniformiv");

		/* Expected indices are 0, 1, 2, ... N */
		for (GLint i = 0; i < m_n_active_subroutines; ++i)
		{
			index_sum += compatible_subroutines[i];
		}

		/* Sum of E1, ..., EN = (E1 + EN) * N / 2 */
		if (((m_n_active_subroutines - 1) * m_n_active_subroutines) / 2 != index_sum)
		{
			tcu::MessageBuilder message = m_context.getTestContext().getLog() << tcu::TestLog::Message;

			message << "Error. Invalid result. Function: getActiveSubroutineUniformiv. idnex: " << uniform
					<< ". pname: " << Utils::pnameToStr(GL_COMPATIBLE_SUBROUTINES) << ". Results: ";

			for (GLint i = 1; i < m_n_active_subroutines; ++i)
			{
				message << compatible_subroutines[i];
			}

			message << tcu::TestLog::EndMessage;

			result = false;
		}
	}

	return result;
}